

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-matchers.h
# Opt level: O0

AssertionResult __thiscall
testing::internal::PredicateFormatterFromMatcher<leveldb::test::IsOKMatcher>::operator()
          (PredicateFormatterFromMatcher<leveldb::test::IsOKMatcher> *this,char *value_text,
          Status *x)

{
  bool bVar1;
  ostream *poVar2;
  AssertionResult *other;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *in_RCX;
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  extraout_RDX;
  AssertionResult AVar3;
  ostream *local_3d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3b8;
  AssertionResult local_398;
  string local_388;
  undefined1 local_368 [8];
  StringMatchResultListener listener;
  stringstream ss;
  ostream aoStack_1c0 [380];
  undefined4 local_44;
  undefined1 local_40 [8];
  Matcher<const_leveldb::Status_&> matcher;
  Status *x_local;
  char *value_text_local;
  PredicateFormatterFromMatcher<leveldb::test::IsOKMatcher> *this_local;
  
  matcher.super_MatcherBase<const_leveldb::Status_&>.impl_.
  super___shared_ptr<const_testing::MatcherInterface<const_leveldb::Status_&>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = in_RCX;
  SafeMatcherCast<leveldb::Status_const&,leveldb::test::IsOKMatcher>
            ((Matcher<const_leveldb::Status_&> *)local_40,(testing *)value_text,(IsOKMatcher *)x);
  bVar1 = MatcherBase<const_leveldb::Status_&>::Matches
                    ((MatcherBase<const_leveldb::Status_&> *)local_40,
                     (Status *)
                     matcher.super_MatcherBase<const_leveldb::Status_&>.impl_.
                     super___shared_ptr<const_testing::MatcherInterface<const_leveldb::Status_&>,_(__gnu_cxx::_Lock_policy)2>
                     ._M_refcount._M_pi);
  if (bVar1) {
    AssertionSuccess();
    local_44 = 1;
  }
  else {
    std::__cxx11::stringstream::stringstream((stringstream *)&listener.field_0x190);
    poVar2 = std::operator<<(aoStack_1c0,"Value of: ");
    poVar2 = std::operator<<(poVar2,(char *)x);
    poVar2 = std::operator<<(poVar2,"\n");
    std::operator<<(poVar2,"Expected: ");
    local_3d0 = (ostream *)0x0;
    if (&stack0x00000000 != (undefined1 *)0x1d0) {
      local_3d0 = aoStack_1c0;
    }
    MatcherBase<const_leveldb::Status_&>::DescribeTo
              ((MatcherBase<const_leveldb::Status_&> *)local_40,local_3d0);
    StringMatchResultListener::StringMatchResultListener((StringMatchResultListener *)local_368);
    bVar1 = MatchPrintAndExplain<leveldb::Status_const,leveldb::Status_const&>
                      ((Status *)
                       matcher.super_MatcherBase<const_leveldb::Status_&>.impl_.
                       super___shared_ptr<const_testing::MatcherInterface<const_leveldb::Status_&>,_(__gnu_cxx::_Lock_policy)2>
                       ._M_refcount._M_pi,(Matcher<const_leveldb::Status_&> *)local_40,
                       (MatchResultListener *)local_368);
    if (bVar1) {
      std::operator<<(aoStack_1c0,
                      "\n  The matcher failed on the initial attempt; but passed when rerun to generate the explanation."
                     );
    }
    poVar2 = std::operator<<(aoStack_1c0,"\n  Actual: ");
    StringMatchResultListener::str_abi_cxx11_(&local_388,(StringMatchResultListener *)local_368);
    std::operator<<(poVar2,(string *)&local_388);
    std::__cxx11::string::~string((string *)&local_388);
    AssertionFailure();
    std::__cxx11::stringstream::str();
    other = AssertionResult::operator<<(&local_398,&local_3b8);
    AssertionResult::AssertionResult((AssertionResult *)this,other);
    std::__cxx11::string::~string((string *)&local_3b8);
    AssertionResult::~AssertionResult(&local_398);
    local_44 = 1;
    StringMatchResultListener::~StringMatchResultListener((StringMatchResultListener *)local_368);
    std::__cxx11::stringstream::~stringstream((stringstream *)&listener.field_0x190);
  }
  Matcher<const_leveldb::Status_&>::~Matcher((Matcher<const_leveldb::Status_&> *)local_40);
  AVar3.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       extraout_RDX._M_t.
       super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_t.
       super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       .
       super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
       ._M_head_impl;
  AVar3._0_8_ = this;
  return AVar3;
}

Assistant:

AssertionResult operator()(const char* value_text, const T& x) const {
    // We convert matcher_ to a Matcher<const T&> *now* instead of
    // when the PredicateFormatterFromMatcher object was constructed,
    // as matcher_ may be polymorphic (e.g. NotNull()) and we won't
    // know which type to instantiate it to until we actually see the
    // type of x here.
    //
    // We write SafeMatcherCast<const T&>(matcher_) instead of
    // Matcher<const T&>(matcher_), as the latter won't compile when
    // matcher_ has type Matcher<T> (e.g. An<int>()).
    // We don't write MatcherCast<const T&> either, as that allows
    // potentially unsafe downcasting of the matcher argument.
    const Matcher<const T&> matcher = SafeMatcherCast<const T&>(matcher_);

    // The expected path here is that the matcher should match (i.e. that most
    // tests pass) so optimize for this case.
    if (matcher.Matches(x)) {
      return AssertionSuccess();
    }

    ::std::stringstream ss;
    ss << "Value of: " << value_text << "\n"
       << "Expected: ";
    matcher.DescribeTo(&ss);

    // Rerun the matcher to "PrintAndExplain" the failure.
    StringMatchResultListener listener;
    if (MatchPrintAndExplain(x, matcher, &listener)) {
      ss << "\n  The matcher failed on the initial attempt; but passed when "
            "rerun to generate the explanation.";
    }
    ss << "\n  Actual: " << listener.str();
    return AssertionFailure() << ss.str();
  }